

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int skipcomment(LoadF *lf,int *cp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lf->n = 0;
  iVar3 = 0;
  iVar4 = -1;
  lVar5 = 0;
  do {
    uVar2 = getc((FILE *)lf->f);
    if (uVar2 == 0xffffffff) goto LAB_00107bb0;
    if (uVar2 != (byte)anon_var_dwarf_51a8[lVar5]) goto LAB_00107b84;
    lVar5 = lVar5 + 1;
    iVar1 = lf->n;
    lf->n = iVar1 + 1;
    lf->buff[iVar1] = (char)uVar2;
  } while (lVar5 != 3);
  lf->n = 0;
  uVar2 = getc((FILE *)lf->f);
LAB_00107b84:
  *cp = uVar2;
  iVar3 = 0;
  if (uVar2 == 0x23) {
    do {
      iVar3 = getc((FILE *)lf->f);
      if (iVar3 == 10) break;
    } while (iVar3 != -1);
    iVar4 = getc((FILE *)lf->f);
    iVar3 = 1;
LAB_00107bb0:
    *cp = iVar4;
  }
  return iVar3;
}

Assistant:

static int skipcomment(LoadF *lf, int *cp) {
    int c = *cp = skipBOM(lf);
    if (c == '#') {  /* first line is a comment (Unix exec. file)? */
        do {  /* skip first line */
            c = getc(lf->f);
        } while (c != EOF && c != '\n');
        *cp = getc(lf->f);  /* skip end-of-line, if present */
        return 1;  /* there was a comment */
    } else return 0;  /* no comment */
}